

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pred_common.h
# Opt level: O1

int get_comp_group_idx_context(MACROBLOCKD *xd)

{
  MB_MODE_INFO *pMVar1;
  MB_MODE_INFO *pMVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  
  pMVar1 = xd->left_mbmi;
  pMVar2 = xd->above_mbmi;
  uVar5 = 0;
  uVar3 = 0;
  if (pMVar2 != (MB_MODE_INFO *)0x0) {
    if (pMVar2->ref_frame[1] < '\x01') {
      uVar3 = (uint)(pMVar2->ref_frame[0] == '\a') * 3;
    }
    else {
      uVar3 = *(ushort *)&pMVar2->field_0xa7 >> 8 & 1;
    }
  }
  if (pMVar1 != (MB_MODE_INFO *)0x0) {
    if (pMVar1->ref_frame[1] < '\x01') {
      uVar5 = (uint)(pMVar1->ref_frame[0] == '\a') * 3;
    }
    else {
      uVar5 = *(ushort *)&pMVar1->field_0xa7 >> 8 & 1;
    }
  }
  uVar4 = 5;
  if (uVar5 + uVar3 < 5) {
    uVar4 = uVar5 + uVar3;
  }
  return uVar4;
}

Assistant:

static inline int get_comp_group_idx_context(const MACROBLOCKD *xd) {
  const MB_MODE_INFO *const above_mi = xd->above_mbmi;
  const MB_MODE_INFO *const left_mi = xd->left_mbmi;
  int above_ctx = 0, left_ctx = 0;

  if (above_mi) {
    if (has_second_ref(above_mi))
      above_ctx = above_mi->comp_group_idx;
    else if (above_mi->ref_frame[0] == ALTREF_FRAME)
      above_ctx = 3;
  }
  if (left_mi) {
    if (has_second_ref(left_mi))
      left_ctx = left_mi->comp_group_idx;
    else if (left_mi->ref_frame[0] == ALTREF_FRAME)
      left_ctx = 3;
  }

  return AOMMIN(5, above_ctx + left_ctx);
}